

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O1

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC2TL1SLHDMultiThread4Test
          (DatarateTestSVC *this)

{
  double *val1;
  uint uVar1;
  undefined8 *puVar2;
  bool bVar3;
  ParamType *pPVar4;
  SEARCH_METHODS *pSVar5;
  long lVar6;
  long lVar7;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  Y4mVideoSource video;
  AssertHelper local_140;
  AssertHelper local_138;
  undefined1 local_130 [16];
  long local_120 [2];
  double *local_110;
  Y4mVideoSource local_108;
  
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x3f;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_threads = 4;
  local_130._0_8_ = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"niklas_1280_720_30.y4m","");
  libaom_test::Y4mVideoSource::Y4mVideoSource(&local_108,(string *)local_130,0,0x3c);
  if ((long *)local_130._0_8_ != local_120) {
    operator_delete((void *)local_130._0_8_);
  }
  pPVar4 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00c82708 +
                (long)(pPVar4->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])(this);
  (this->super_DatarateTest).tile_columns_ = 1;
  (this->super_DatarateTest).tile_rows_ = 1;
  this->number_temporal_layers_ = 2;
  this->number_spatial_layers_ = 1;
  uVar1 = (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  this->target_layer_bitrate_[0] = (uVar1 * 0x3c) / 100;
  this->target_layer_bitrate_[1] = uVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_130);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&this->super_DatarateTest,&local_108);
    }
    bVar3 = local_130[8];
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_130);
    if (bVar3 == false) {
      if (0 < this->number_spatial_layers_ * this->number_temporal_layers_) {
        local_110 = this->effective_datarate_tl;
        lVar6 = 0;
        lVar7 = 0;
        do {
          val1 = (double *)((long)local_110 + lVar6);
          local_140.data_ =
               (AssertHelperData *)((double)*(int *)((long)local_110 + lVar7 * 4 + -0x2b8) * 0.7);
          testing::internal::CmpHelperGE<double,double>
                    ((internal *)local_130,"effective_datarate_tl[i]",
                     "target_layer_bitrate_[i] * 0.70",val1,(double *)&local_140);
          if (local_130[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_140);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&(local_140.data_)->line,
                       " The datarate for the file is lower than target by too much!",0x3c);
            if ((undefined8 *)CONCAT71(local_130._9_7_,local_130[8]) == (undefined8 *)0x0) {
              pSVar5 = "";
            }
            else {
              pSVar5 = *(SEARCH_METHODS **)CONCAT71(local_130._9_7_,local_130[8]);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_138,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                       ,0x81e,(char *)pSVar5);
            testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_140);
LAB_0062dbe2:
            testing::internal::AssertHelper::~AssertHelper(&local_138);
            if (local_140.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_140.data_ + 8))();
            }
            puVar2 = (undefined8 *)CONCAT71(local_130._9_7_,local_130[8]);
            if (puVar2 != (undefined8 *)0x0) {
              if ((undefined8 *)*puVar2 != puVar2 + 2) {
                operator_delete((undefined8 *)*puVar2);
              }
              operator_delete(puVar2);
            }
            break;
          }
          puVar2 = (undefined8 *)CONCAT71(local_130._9_7_,local_130[8]);
          if (puVar2 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar2 != puVar2 + 2) {
              operator_delete((undefined8 *)*puVar2);
            }
            operator_delete(puVar2);
          }
          local_140.data_ =
               (AssertHelperData *)((double)*(int *)((long)local_110 + lVar7 * 4 + -0x2b8) * 1.45);
          testing::internal::CmpHelperLE<double,double>
                    ((internal *)local_130,"effective_datarate_tl[i]",
                     "target_layer_bitrate_[i] * 1.45",val1,(double *)&local_140);
          if (local_130[0] == (string)0x0) {
            testing::Message::Message((Message *)&local_140);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&(local_140.data_)->line,
                       " The datarate for the file is greater than target by too much!",0x3e);
            if ((undefined8 *)CONCAT71(local_130._9_7_,local_130[8]) == (undefined8 *)0x0) {
              pSVar5 = "";
            }
            else {
              pSVar5 = *(SEARCH_METHODS **)CONCAT71(local_130._9_7_,local_130[8]);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_138,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                       ,0x820,(char *)pSVar5);
            testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_140);
            goto LAB_0062dbe2;
          }
          puVar2 = (undefined8 *)CONCAT71(local_130._9_7_,local_130[8]);
          if (puVar2 != (undefined8 *)0x0) {
            if ((undefined8 *)*puVar2 != puVar2 + 2) {
              operator_delete((undefined8 *)*puVar2);
            }
            operator_delete(puVar2);
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 8;
        } while (lVar7 < (long)this->number_spatial_layers_ * (long)this->number_temporal_layers_);
      }
      goto LAB_0062d9ca;
    }
  }
  testing::Message::Message((Message *)local_130);
  testing::internal::AssertHelper::AssertHelper
            (&local_140,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
             ,0x81c,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_140,(Message *)local_130);
  testing::internal::AssertHelper::~AssertHelper(&local_140);
  if ((long *)local_130._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_130._0_8_ + 8))();
  }
LAB_0062d9ca:
  libaom_test::Y4mVideoSource::~Y4mVideoSource(&local_108);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC2TL1SLHDMultiThread4Test() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 63;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;
    cfg_.g_threads = 4;

    ::libaom_test::Y4mVideoSource video("niklas_1280_720_30.y4m", 0, 60);
    const int bitrate_array[2] = { 600, 1200 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    tile_columns_ = 1;
    tile_rows_ = 1;
    number_temporal_layers_ = 2;
    number_spatial_layers_ = 1;
    target_layer_bitrate_[0] = 60 * cfg_.rc_target_bitrate / 100;
    target_layer_bitrate_[1] = cfg_.rc_target_bitrate;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    for (int i = 0; i < number_temporal_layers_ * number_spatial_layers_; i++) {
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.70)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.45)
          << " The datarate for the file is greater than target by too much!";
    }
  }